

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void __thiscall VRle::Data::opGeneric(Data *this,Data *aObj,Data *bObj,Op op)

{
  short sVar1;
  bool bVar2;
  Span *pSVar3;
  size_t sVar4;
  Span *pSVar5;
  pointer dst;
  EVP_PKEY_CTX *pEVar6;
  long in_RDI;
  size_t count_1;
  Result result;
  long count;
  Span *bEnd;
  Span *bPtr;
  Span *aEnd;
  Span *aPtr;
  View b;
  View a;
  Data *in_stack_fffffffffffff6d8;
  Data *in_stack_fffffffffffff6e0;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  VRect *in_stack_fffffffffffff700;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *in_stack_fffffffffffff710;
  View local_a8;
  View local_98;
  EVP_PKEY_CTX *local_88;
  Span *local_80;
  Span *local_78;
  Span *local_70;
  Span *local_68;
  VRect local_60;
  VRect local_50;
  View local_40;
  View local_30 [3];
  
  local_30[0] = view(in_stack_fffffffffffff6e0);
  local_40 = view(in_stack_fffffffffffff6e0);
  View::size(local_30);
  View::size(&local_40);
  std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve
            (in_stack_fffffffffffff710,CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708)
            );
  local_50 = bbox(in_stack_fffffffffffff6d8);
  local_60 = bbox(in_stack_fffffffffffff6d8);
  bVar2 = VRect::intersects(in_stack_fffffffffffff700,
                            (VRect *)CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_68 = View::data(local_30);
    pSVar3 = View::data(local_30);
    sVar4 = View::size(local_30);
    local_70 = pSVar3 + sVar4;
    local_78 = View::data(&local_40);
    pSVar3 = View::data(&local_40);
    sVar4 = View::size(&local_40);
    local_80 = pSVar3 + sVar4;
    while( true ) {
      bVar2 = false;
      if (local_68 != local_70) {
        bVar2 = local_68->y < local_78->y;
      }
      if (!bVar2) break;
      local_68 = local_68 + 1;
    }
    pSVar3 = local_68;
    pSVar5 = View::data(local_30);
    local_88 = (EVP_PKEY_CTX *)((long)pSVar3 - (long)pSVar5 >> 3);
    if (local_88 != (EVP_PKEY_CTX *)0x0) {
      pSVar3 = View::data(local_30);
      copy((EVP_PKEY_CTX *)pSVar3,local_88);
    }
    if (local_68 != local_70) {
      while( true ) {
        bVar2 = false;
        if (local_78 != local_80) {
          bVar2 = local_78->y < local_68->y;
        }
        if (!bVar2) break;
        local_78 = local_78 + 1;
      }
    }
    pSVar3 = local_78;
    pSVar5 = View::data(&local_40);
    local_88 = (EVP_PKEY_CTX *)((long)pSVar3 - (long)pSVar5 >> 3);
    if (local_88 != (EVP_PKEY_CTX *)0x0) {
      pSVar5 = View::data(&local_40);
      copy((EVP_PKEY_CTX *)pSVar5,local_88);
    }
    View::View(&local_98,local_68,(long)local_70 - (long)local_68 >> 3);
    View::View(&local_a8,local_78,(long)local_80 - (long)local_78 >> 3);
    std::array<VRle::Span,_255UL>::array((array<VRle::Span,_255UL> *)pSVar3);
    while( true ) {
      sVar4 = View::size(local_30);
      bVar2 = false;
      if (sVar4 != 0) {
        sVar4 = View::size(&local_40);
        bVar2 = sVar4 != 0;
      }
      if (!bVar2) break;
      pEVar6 = (EVP_PKEY_CTX *)
               _opGeneric((rle_view *)result._M_elems[0x5f],(rle_view *)result._M_elems[0x5e],
                          (Result *)result._M_elems[0x5d],result._M_elems[0x5c]._4_4_);
      if (pEVar6 != (EVP_PKEY_CTX *)0x0) {
        dst = std::array<VRle::Span,_255UL>::data((array<VRle::Span,_255UL> *)0x1229b5);
        copy((EVP_PKEY_CTX *)dst,pEVar6);
      }
    }
    sVar4 = View::size(&local_40);
    if (sVar4 != 0) {
      pSVar3 = View::data(&local_40);
      pEVar6 = (EVP_PKEY_CTX *)View::size(&local_40);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
    }
    sVar4 = View::size(local_30);
    if (sVar4 != 0) {
      pSVar3 = View::data(local_30);
      pEVar6 = (EVP_PKEY_CTX *)View::size(local_30);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
    }
  }
  else {
    pSVar3 = View::data(local_30);
    sVar1 = pSVar3->y;
    pSVar3 = View::data(&local_40);
    if (sVar1 < pSVar3->y) {
      pSVar3 = View::data(local_30);
      pEVar6 = (EVP_PKEY_CTX *)View::size(local_30);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
      pSVar3 = View::data(&local_40);
      pEVar6 = (EVP_PKEY_CTX *)View::size(&local_40);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
    }
    else {
      pSVar3 = View::data(&local_40);
      pEVar6 = (EVP_PKEY_CTX *)View::size(&local_40);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
      pSVar3 = View::data(local_30);
      pEVar6 = (EVP_PKEY_CTX *)View::size(local_30);
      copy((EVP_PKEY_CTX *)pSVar3,pEVar6);
    }
  }
  *(undefined1 *)(in_RDI + 0x30) = 1;
  return;
}

Assistant:

void VRle::Data::opGeneric(const VRle::Data &aObj, const VRle::Data &bObj,
                           Op op)
{
    // This routine assumes, obj1(span_y) < obj2(span_y).

    auto a = aObj.view();
    auto b = bObj.view();

    // reserve some space for the result vector.
    mSpans.reserve(a.size() + b.size());

    // if two rle are disjoint
    if (!aObj.bbox().intersects(bObj.bbox())) {
        if (a.data()[0].y < b.data()[0].y) {
            copy(a.data(), a.size(), mSpans);
            copy(b.data(), b.size(), mSpans);
        } else {
            copy(b.data(), b.size(), mSpans);
            copy(a.data(), a.size(), mSpans);
        }
    } else {
        auto aPtr = a.data();
        auto aEnd = a.data() + a.size();
        auto bPtr = b.data();
        auto bEnd = b.data() + b.size();

        // 1. forward a till it intersects with b
        while ((aPtr != aEnd) && (aPtr->y < bPtr->y)) aPtr++;

        auto count = aPtr - a.data();
        if (count) copy(a.data(), count, mSpans);

        // 2. forward b till it intersects with a
        if (aPtr != aEnd)
            while ((bPtr != bEnd) && (bPtr->y < aPtr->y)) bPtr++;

        count = bPtr - b.data();
        if (count) copy(b.data(), count, mSpans);

        // update a and b object
        a = {aPtr, size_t(aEnd - aPtr)};
        b = {bPtr, size_t(bEnd - bPtr)};

        // 3. calculate the intersect region
        Result result;

        // run till all the spans are processed
        while (a.size() && b.size()) {
            auto count = _opGeneric(a, b, result, op);
            if (count) copy(result.data(), count, mSpans);
        }
        // 3. copy the rest
        if (b.size()) copy(b.data(), b.size(), mSpans);
        if (a.size()) copy(a.data(), a.size(), mSpans);
    }

    mBboxDirty = true;
}